

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O0

void duckdb::UnaryExecutor::
     ExecuteStandard<duckdb::interval_t,long,duckdb::UnaryOperatorWrapper,duckdb::DatePart::MinutesOperator>
               (Vector *input,Vector *result,idx_t count,void *dataptr,bool adds_nulls,
               FunctionErrors errors)

{
  interval_t input_00;
  VectorType VVar1;
  bool bVar2;
  long lVar3;
  ValidityMask *result_data_00;
  idx_t iVar4;
  interval_t *piVar5;
  ValidityMask *pVVar6;
  idx_t in_RDX;
  Vector *in_RSI;
  Vector *in_RDI;
  undefined4 in_R8D;
  char in_R9B;
  uint uVar7;
  interval_t *ldata_3;
  long *result_data_3;
  UnifiedVectorFormat vdata;
  SelectionVector *offsets;
  interval_t *ldata_2;
  long *result_data_2;
  Vector *dictionary_values;
  optional_idx dict_size;
  interval_t *ldata_1;
  long *result_data_1;
  interval_t *ldata;
  long *result_data;
  Vector *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  SelectionVector *in_stack_fffffffffffffe68;
  UnifiedVectorFormat *in_stack_fffffffffffffe70;
  Vector *in_stack_fffffffffffffe78;
  Vector *in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  VectorType vector_type_p;
  Vector *in_stack_fffffffffffffe90;
  UnifiedVectorFormat *result_mask;
  ValidityMask *in_stack_fffffffffffffea0;
  SelectionVector *in_stack_fffffffffffffea8;
  Vector *in_stack_fffffffffffffeb0;
  long *in_stack_fffffffffffffeb8;
  interval_t *in_stack_fffffffffffffec0;
  undefined1 uVar8;
  void *in_stack_fffffffffffffec8;
  ValidityMask *in_stack_fffffffffffffed0;
  ValidityMask *in_stack_fffffffffffffed8;
  idx_t in_stack_fffffffffffffee0;
  long *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  UnifiedVectorFormat *in_stack_ffffffffffffff20;
  idx_t in_stack_ffffffffffffff28;
  Vector *in_stack_ffffffffffffff30;
  UnifiedVectorFormat local_c8;
  SelectionVector *local_80;
  interval_t *local_78;
  long *local_70;
  Vector *local_68;
  optional_idx local_60;
  interval_t *local_58;
  ValidityMask *local_50;
  undefined8 local_48;
  int64_t local_40;
  interval_t *local_38;
  long *local_30;
  char local_22;
  byte local_21;
  idx_t local_18;
  Vector *local_10;
  
  vector_type_p = (VectorType)((ulong)in_stack_fffffffffffffe88 >> 0x38);
  local_21 = (byte)in_R8D & 1;
  local_22 = in_R9B;
  local_18 = in_RDX;
  local_10 = in_RSI;
  VVar1 = Vector::GetVectorType(in_RDI);
  if (VVar1 == FLAT_VECTOR) {
    Vector::SetVectorType(in_stack_fffffffffffffe90,vector_type_p);
    uVar8 = (undefined1)((ulong)in_stack_fffffffffffffec0 >> 0x38);
    local_50 = (ValidityMask *)FlatVector::GetData<long>((Vector *)0x1fe5258);
    piVar5 = FlatVector::GetData<duckdb::interval_t>((Vector *)0x1fe526d);
    pVVar6 = local_50;
    local_58 = piVar5;
    result_data_00 = FlatVector::Validity((Vector *)0x1fe52af);
    FlatVector::Validity((Vector *)0x1fe52c4);
    ExecuteFlat<duckdb::interval_t,long,duckdb::UnaryOperatorWrapper,duckdb::DatePart::MinutesOperator>
              ((interval_t *)CONCAT44(in_R8D,in_stack_fffffffffffffef0),(long *)result_data_00,
               local_18,pVVar6,(ValidityMask *)piVar5,in_stack_fffffffffffffec8,(bool)uVar8);
  }
  else if (VVar1 == CONSTANT_VECTOR) {
    Vector::SetVectorType(in_stack_fffffffffffffe90,vector_type_p);
    uVar8 = (undefined1)((ulong)in_stack_fffffffffffffea8 >> 0x38);
    local_30 = ConstantVector::GetData<long>((Vector *)0x1fe5186);
    local_38 = ConstantVector::GetData<duckdb::interval_t>((Vector *)0x1fe519b);
    bVar2 = ConstantVector::IsNull((Vector *)0x1fe51b0);
    if (bVar2) {
      ConstantVector::SetNull(in_stack_fffffffffffffeb0,(bool)uVar8);
    }
    else {
      ConstantVector::SetNull(in_stack_fffffffffffffeb0,(bool)uVar8);
      local_48._0_4_ = local_38->months;
      local_48._4_4_ = local_38->days;
      local_40 = local_38->micros;
      ConstantVector::Validity(local_10);
      input_00.micros = (int64_t)in_stack_fffffffffffffe80;
      input_00._0_8_ = in_stack_fffffffffffffe78;
      lVar3 = UnaryOperatorWrapper::
              Operation<duckdb::DatePart::MinutesOperator,duckdb::interval_t,long>
                        (input_00,(ValidityMask *)in_stack_fffffffffffffe70,
                         (idx_t)in_stack_fffffffffffffe68,
                         (void *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
      *local_30 = lVar3;
    }
  }
  else {
    if ((VVar1 == DICTIONARY_VECTOR) && (local_22 == '\0')) {
      local_60 = DictionaryVector::DictionarySize(in_stack_fffffffffffffe58);
      bVar2 = optional_idx::IsValid(&local_60);
      if ((bVar2) &&
         (iVar4 = optional_idx::GetIndex((optional_idx *)in_stack_fffffffffffffea0),
         iVar4 * 2 < local_18 || iVar4 * 2 - local_18 == 0)) {
        local_68 = DictionaryVector::Child((Vector *)0x1fe5369);
        VVar1 = Vector::GetVectorType(local_68);
        if (VVar1 == FLAT_VECTOR) {
          local_70 = FlatVector::GetData<long>((Vector *)0x1fe5393);
          uVar8 = (undefined1)((ulong)in_stack_fffffffffffffec0 >> 0x38);
          piVar5 = FlatVector::GetData<duckdb::interval_t>((Vector *)0x1fe53a8);
          local_78 = piVar5;
          optional_idx::GetIndex((optional_idx *)piVar5);
          FlatVector::Validity((Vector *)0x1fe53e9);
          FlatVector::Validity((Vector *)0x1fe53fb);
          ExecuteFlat<duckdb::interval_t,long,duckdb::UnaryOperatorWrapper,duckdb::DatePart::MinutesOperator>
                    ((interval_t *)CONCAT44(in_R8D,in_stack_fffffffffffffef0),
                     in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                     in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,(bool)uVar8);
          local_80 = DictionaryVector::SelVector((Vector *)0x1fe543b);
          optional_idx::GetIndex((optional_idx *)piVar5);
          Vector::Dictionary(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                             (idx_t)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
          return;
        }
      }
    }
    result_mask = &local_c8;
    UnifiedVectorFormat::UnifiedVectorFormat(in_stack_fffffffffffffe70);
    Vector::ToUnifiedFormat
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    Vector::SetVectorType(in_stack_fffffffffffffe90,vector_type_p);
    FlatVector::GetData<long>((Vector *)0x1fe54e3);
    UnifiedVectorFormat::GetData<duckdb::interval_t>(&local_c8);
    pVVar6 = FlatVector::Validity((Vector *)0x1fe554e);
    uVar7 = local_21 & 1;
    ExecuteLoop<duckdb::interval_t,long,duckdb::UnaryOperatorWrapper,duckdb::DatePart::MinutesOperator>
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,(idx_t)in_stack_fffffffffffffeb0,
               in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,(ValidityMask *)result_mask,
               in_stack_fffffffffffffed0,SUB81((ulong)pVVar6 >> 0x38,0));
    UnifiedVectorFormat::~UnifiedVectorFormat
              ((UnifiedVectorFormat *)CONCAT44(in_stack_fffffffffffffe64,uVar7));
  }
  return;
}

Assistant:

static inline void ExecuteStandard(Vector &input, Vector &result, idx_t count, void *dataptr, bool adds_nulls,
	                                   FunctionErrors errors = FunctionErrors::CAN_THROW_RUNTIME_ERROR) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);
			auto ldata = ConstantVector::GetData<INPUT_TYPE>(input);

			if (ConstantVector::IsNull(input)) {
				ConstantVector::SetNull(result, true);
			} else {
				ConstantVector::SetNull(result, false);
				*result_data = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
				    *ldata, ConstantVector::Validity(result), 0, dataptr);
			}
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = FlatVector::GetData<INPUT_TYPE>(input);

			ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, FlatVector::Validity(input),
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		case VectorType::DICTIONARY_VECTOR: {
			// dictionary vector - we can run the function ONLY on the dictionary in some cases
			// we can only do this if the function does not throw errors
			// we can execute the function on a value that is in the dictionary but that is not referenced
			// if the function can throw errors - this will result in us (incorrectly) throwing an error
			if (errors == FunctionErrors::CANNOT_ERROR) {
				static constexpr idx_t DICTIONARY_THRESHOLD = 2;
				auto dict_size = DictionaryVector::DictionarySize(input);
				if (dict_size.IsValid() && dict_size.GetIndex() * DICTIONARY_THRESHOLD <= count) {
					// we can operate directly on the dictionary if we have a dictionary size
					// but this only makes sense if the dictionary size is smaller than the count by some factor
					auto &dictionary_values = DictionaryVector::Child(input);
					if (dictionary_values.GetVectorType() == VectorType::FLAT_VECTOR) {
						// execute the function over the dictionary
						auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
						auto ldata = FlatVector::GetData<INPUT_TYPE>(dictionary_values);
						ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(
						    ldata, result_data, dict_size.GetIndex(), FlatVector::Validity(dictionary_values),
						    FlatVector::Validity(result), dataptr, adds_nulls);
						// slice the result with the original offsets
						auto &offsets = DictionaryVector::SelVector(input);
						result.Dictionary(result, dict_size.GetIndex(), offsets, count);
						break;
					}
				}
			}
			DUCKDB_EXPLICIT_FALLTHROUGH;
		}
#endif
		default: {
			UnifiedVectorFormat vdata;
			input.ToUnifiedFormat(count, vdata);

			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = UnifiedVectorFormat::GetData<INPUT_TYPE>(vdata);

			ExecuteLoop<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, vdata.sel, vdata.validity,
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		}
	}